

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

bool __thiscall
amrex::BoxArray::coarsenable(BoxArray *this,IntVect *refinement_ratio,IntVect *min_width)

{
  long *plVar1;
  BATType BVar2;
  element_type *peVar3;
  pointer pBVar4;
  pointer pBVar5;
  IntVect IVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  IndexType IVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int dir_1;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  IntVect IVar23;
  Box result;
  Box bx;
  ulong local_58;
  int local_50;
  Box local_4c;
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar4 = *(pointer *)
            ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data + 8);
  pBVar5 = (peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = ((long)pBVar4 - (long)pBVar5) / 0x1c;
  if (pBVar4 == pBVar5) {
    bVar10 = false;
  }
  else {
    bVar10 = false;
    operator[](&local_4c,this,0);
    bVar9 = Box::coarsenable(&local_4c,refinement_ratio,min_width);
    if (bVar9) {
      peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      BVar2 = (this->m_bat).m_bat_type;
      if (BVar2 == bndryReg) {
        lVar18 = 0;
        if (lVar14 < 1) {
          lVar14 = lVar18;
        }
        bVar10 = true;
        while (bVar9 = lVar14 != 0, lVar14 = lVar14 + -1, bVar9) {
          BATbndryReg::operator()
                    (&bx,&(this->m_bat).m_op.m_bndryReg,
                     (Box *)(*(long *)&(peVar3->m_abox).
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data + lVar18));
          if (bVar10 == false) {
            bVar10 = false;
          }
          else {
            bVar10 = Box::coarsenable(&bx,refinement_ratio,min_width);
          }
          lVar18 = lVar18 + 0x1c;
        }
      }
      else if (BVar2 == null) {
        lVar18 = 0;
        if (lVar14 < 1) {
          lVar14 = lVar18;
        }
        bVar10 = true;
        while (bVar9 = lVar14 != 0, lVar14 = lVar14 + -1, bVar9) {
          if (bVar10 == false) {
            bVar10 = false;
          }
          else {
            bVar10 = Box::coarsenable((Box *)(*(long *)&(peVar3->m_abox).
                                                                                                                
                                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                                                  .
                                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                                  ._M_impl.super__Vector_impl_data + lVar18),
                                      refinement_ratio,min_width);
          }
          lVar18 = lVar18 + 0x1c;
        }
      }
      else {
        IVar11 = BATransformer::index_type(&this->m_bat);
        IVar23 = BATransformer::coarsen_ratio(&this->m_bat);
        uVar15 = IVar23.vect._0_8_;
        local_58 = uVar15;
        lVar18 = 0;
        if (lVar14 < 1) {
          lVar14 = lVar18;
        }
        local_50 = IVar23.vect[2];
        bVar10 = true;
        IVar6 = IVar23;
        for (; iVar21 = IVar6.vect[2], lVar18 != lVar14; lVar18 = lVar18 + 1) {
          lVar17 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data;
          plVar1 = (long *)(lVar17 + lVar18 * 0x1c);
          lVar19 = *plVar1;
          lVar7 = plVar1[1];
          plVar1 = (long *)(lVar17 + 0xc + lVar18 * 0x1c);
          lVar17 = *plVar1;
          lVar8 = plVar1[1];
          result.bigend.vect[1] = (int)((ulong)lVar17 >> 0x20);
          result.bigend.vect[2] = (int)lVar8;
          result.btype.itype = (int)((ulong)lVar8 >> 0x20);
          result.smallend.vect[2] = (int)lVar7;
          result.bigend.vect[0] = (int)((ulong)lVar7 >> 0x20);
          iVar20 = IVar6.vect[0];
          iVar22 = IVar23.vect[1];
          result.smallend.vect[1] = (int)((ulong)lVar19 >> 0x20);
          uVar13 = result.smallend.vect[1];
          if (uVar15 >> 0x20 == 1 && IVar23.vect[0] == 1) {
            result.smallend.vect._0_8_ = lVar19;
            if (iVar21 != 1) goto LAB_0041c4db;
          }
          else {
            result.smallend.vect[0] = (int)lVar19;
            if (iVar20 != 1) {
              if (iVar20 == 4) {
                if (result.smallend.vect[0] < 0) {
                  result.smallend.vect[0] = result.smallend.vect[0] >> 2;
                }
                else {
                  result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
                }
              }
              else if (iVar20 == 2) {
                if (result.smallend.vect[0] < 0) {
                  result.smallend.vect[0] = result.smallend.vect[0] >> 1;
                }
                else {
                  result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
                }
              }
              else if (result.smallend.vect[0] < 0) {
                result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar20);
              }
              else {
                result.smallend.vect[0] = result.smallend.vect[0] / iVar20;
              }
            }
            if (iVar22 != 1) {
              if (iVar22 == 4) {
                if (lVar19 < 0) {
                  uVar13 = result.smallend.vect[1] >> 2;
                }
                else {
                  uVar13 = (uint)result.smallend.vect[1] >> 2;
                }
              }
              else if (iVar22 == 2) {
                if (lVar19 < 0) {
                  uVar13 = result.smallend.vect[1] >> 1;
                }
                else {
                  uVar13 = (uint)result.smallend.vect[1] >> 1;
                }
              }
              else if (lVar19 < 0) {
                uVar13 = ~(~result.smallend.vect[1] / iVar22);
              }
              else {
                uVar13 = result.smallend.vect[1] / iVar22;
              }
            }
LAB_0041c4db:
            result.smallend.vect[1] = uVar13;
            if (iVar21 != 1) {
              if (iVar21 == 4) {
                if (result.smallend.vect[2] < 0) {
                  result.smallend.vect[2] = result.smallend.vect[2] >> 2;
                }
                else {
                  result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
                }
              }
              else if (iVar21 == 2) {
                if (result.smallend.vect[2] < 0) {
                  result.smallend.vect[2] = result.smallend.vect[2] >> 1;
                }
                else {
                  result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
                }
              }
              else if (result.smallend.vect[2] < 0) {
                result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar21);
              }
              else {
                result.smallend.vect[2] = result.smallend.vect[2] / iVar21;
              }
            }
            result.btype.itype = (uint)((ulong)lVar8 >> 0x20);
            result.bigend.vect[2] = (int)lVar8;
            if (result.btype.itype == 0) {
              uVar13 = result.bigend.vect[0];
              if (iVar20 != 1) {
                if (iVar20 == 4) {
                  uVar13 = result.bigend.vect[0] >> 2;
                  if (-1 < lVar7) {
                    uVar13 = (uint)result.bigend.vect[0] >> 2;
                  }
                }
                else if (iVar20 == 2) {
                  uVar13 = result.bigend.vect[0] >> 1;
                  if (-1 < lVar7) {
                    uVar13 = (uint)result.bigend.vect[0] >> 1;
                  }
                }
                else if (lVar7 < 0) {
                  uVar13 = ~(~result.bigend.vect[0] / iVar20);
                }
                else {
                  uVar13 = result.bigend.vect[0] / iVar20;
                }
              }
              result.bigend.vect[0] = uVar13;
              uVar13 = result.bigend.vect[1];
              if (iVar22 != 1) {
                if (iVar22 == 4) {
                  uVar13 = result.bigend.vect[1] >> 2;
                  if (-1 < lVar17) {
                    uVar13 = (uint)result.bigend.vect[1] >> 2;
                  }
                }
                else if (iVar22 == 2) {
                  uVar13 = result.bigend.vect[1] >> 1;
                  if (-1 < lVar17) {
                    uVar13 = (uint)result.bigend.vect[1] >> 1;
                  }
                }
                else if (lVar17 < 0) {
                  uVar13 = ~(~result.bigend.vect[1] / iVar22);
                }
                else {
                  uVar13 = result.bigend.vect[1] / iVar22;
                }
              }
              result.bigend.vect[1] = uVar13;
              uVar13 = result.bigend.vect[2];
              if (iVar21 != 1) {
                if (iVar21 == 4) {
                  uVar13 = result.bigend.vect[2] >> 2;
                  if (-1 < result.bigend.vect[2]) {
                    uVar13 = (uint)result.bigend.vect[2] >> 2;
                  }
                }
                else if (iVar21 == 2) {
                  uVar13 = result.bigend.vect[2] >> 1;
                  if (-1 < result.bigend.vect[2]) {
                    uVar13 = (uint)result.bigend.vect[2] >> 1;
                  }
                }
                else if (result.bigend.vect[2] < 0) {
                  uVar13 = ~(~result.bigend.vect[2] / iVar21);
                }
                else {
                  uVar13 = result.bigend.vect[2] / iVar21;
                }
              }
            }
            else {
              bx.smallend.vect[0] = 0;
              bx.smallend.vect[1] = 0;
              bx.smallend.vect[2] = 0;
              for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
                if (((result.btype.itype >> ((uint)lVar19 & 0x1f) & 1) != 0) &&
                   (result.bigend.vect[lVar19] % *(int *)((long)&local_58 + lVar19 * 4) != 0)) {
                  bx.smallend.vect[lVar19] = 1;
                }
              }
              uVar13 = result.bigend.vect[0];
              if (iVar20 != 1) {
                if (iVar20 == 4) {
                  uVar13 = result.bigend.vect[0] >> 2;
                  if (-1 < lVar7) {
                    uVar13 = (uint)result.bigend.vect[0] >> 2;
                  }
                }
                else if (iVar20 == 2) {
                  uVar13 = result.bigend.vect[0] >> 1;
                  if (-1 < lVar7) {
                    uVar13 = (uint)result.bigend.vect[0] >> 1;
                  }
                }
                else if (lVar7 < 0) {
                  uVar13 = ~(~result.bigend.vect[0] / iVar20);
                }
                else {
                  uVar13 = result.bigend.vect[0] / iVar20;
                }
              }
              uVar16 = result.bigend.vect[1];
              if (iVar22 != 1) {
                if (iVar22 == 4) {
                  uVar16 = result.bigend.vect[1] >> 2;
                  if (-1 < lVar17) {
                    uVar16 = (uint)result.bigend.vect[1] >> 2;
                  }
                }
                else if (iVar22 == 2) {
                  uVar16 = result.bigend.vect[1] >> 1;
                  if (-1 < lVar17) {
                    uVar16 = (uint)result.bigend.vect[1] >> 1;
                  }
                }
                else if (lVar17 < 0) {
                  uVar16 = ~(~result.bigend.vect[1] / iVar22);
                }
                else {
                  uVar16 = result.bigend.vect[1] / iVar22;
                }
              }
              uVar12 = result.bigend.vect[2];
              if (iVar21 != 1) {
                if (iVar21 == 4) {
                  uVar12 = result.bigend.vect[2] >> 2;
                  if (-1 < result.bigend.vect[2]) {
                    uVar12 = (uint)result.bigend.vect[2] >> 2;
                  }
                }
                else if (iVar21 == 2) {
                  uVar12 = result.bigend.vect[2] >> 1;
                  if (-1 < result.bigend.vect[2]) {
                    uVar12 = (uint)result.bigend.vect[2] >> 1;
                  }
                }
                else if (result.bigend.vect[2] < 0) {
                  uVar12 = ~(~result.bigend.vect[2] / iVar21);
                }
                else {
                  uVar12 = result.bigend.vect[2] / iVar21;
                }
              }
              result.bigend.vect[0] = uVar13 + bx.smallend.vect[0];
              result.bigend.vect[1] = uVar16 + bx.smallend.vect[1];
              uVar13 = uVar12 + bx.smallend.vect[2];
            }
            result.bigend.vect[2] = uVar13;
          }
          bx.bigend.vect[1] = result.bigend.vect[1];
          bx.bigend.vect[2] = result.bigend.vect[2];
          bx.btype = result.btype;
          bx.smallend.vect[0] = result.smallend.vect[0];
          bx.smallend.vect[1] = result.smallend.vect[1];
          bx.smallend.vect[2] = result.smallend.vect[2];
          bx.bigend.vect[0] = result.bigend.vect[0];
          for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
            uVar13 = 1 << ((byte)lVar17 & 0x1f);
            uVar16 = (uint)lVar17;
            bx.bigend.vect[lVar17] =
                 (bx.bigend.vect[lVar17] + (uint)((IVar11.itype >> (uVar16 & 0x1f) & 1) != 0)) -
                 (uint)((bx.btype.itype >> (uVar16 & 0x1f) & 1) != 0);
            if ((IVar11.itype >> (uVar16 & 0x1f) & 1) == 0) {
              bx.btype.itype = ~uVar13 & bx.btype.itype;
            }
            else {
              bx.btype.itype = uVar13 | bx.btype.itype;
            }
          }
          if (bVar10 == false) {
            bVar10 = false;
          }
          else {
            bVar10 = Box::coarsenable(&bx,refinement_ratio,min_width);
            IVar6.vect[2] = iVar21;
            IVar6.vect[0] = (int)uVar15;
            IVar6.vect[1] = (int)(uVar15 >> 0x20);
          }
        }
      }
    }
  }
  return bVar10;
}

Assistant:

bool
BoxArray::coarsenable (const IntVect& refinement_ratio, const IntVect& min_width) const
{
    const Long sz = size();
    if(size() == 0) return false;

    const Box& first = (*this)[0];
    bool res = first.coarsenable(refinement_ratio,min_width);
    if (res == false) return false;

    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = bxs[ibox];
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = amrex::convert(amrex::coarsen(bxs[ibox],cr),t);
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(&&:res)
#endif
        for (Long ibox = 0; ibox < sz; ++ibox)
        {
            const Box& thisbox = m_bat.m_op.m_bndryReg(bxs[ibox]);
            res = res && thisbox.coarsenable(refinement_ratio,min_width);
        }
    }

    return res;
}